

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

vm_obj_id_t CVmObjStrComp::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t case_sensitive_00;
  vm_val_t *pvVar3;
  size_t sVar4;
  vm_val_t *lst_00;
  int in_ESI;
  CVmObjStrCompMapReaderList reader;
  utf8_ptr ustrp;
  char *strp;
  vm_val_t val;
  vm_val_t sublst;
  int ec;
  size_t i;
  size_t total_chars;
  size_t equiv_cnt;
  CVmObjStrComp *obj;
  vm_obj_id_t id;
  vm_val_t *lst;
  int case_sensitive;
  size_t trunc_len;
  vm_val_t *in_stack_ffffffffffffff58;
  vm_obj_id_t obj_id;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  vm_val_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  utf8_ptr in_stack_ffffffffffffff78;
  vm_val_t *in_stack_ffffffffffffff80;
  ulong local_50;
  CVmObjStrCompMapReader *reader_00;
  ulong total_chars_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ESI != 3) {
    err_throw(0);
  }
  pvVar3 = CVmStack::get(0);
  if (pvVar3->typ == VM_NIL) {
    CVmStack::discard();
  }
  else {
    CVmBif::pop_int_val();
  }
  iVar1 = CVmBif::pop_bool_val();
  pvVar3 = CVmStack::get(0);
  if (pvVar3->typ == VM_NIL) {
    pvVar3 = (vm_val_t *)0x0;
    total_chars_00 = 0;
    reader_00 = (CVmObjStrCompMapReader *)0x0;
  }
  else {
    pvVar3 = CVmStack::get(0);
    iVar2 = vm_val_t::is_listlike
                      ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if ((iVar2 == 0) || (iVar2 = vm_val_t::ll_length(in_stack_ffffffffffffff68), iVar2 < 0)) {
      err_throw(0);
    }
    reader_00 = (CVmObjStrCompMapReader *)0x0;
    total_chars_00 = (ulong)iVar2;
    for (local_50 = 1; local_50 <= total_chars_00; local_50 = local_50 + 1) {
      utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffff78);
      vm_val_t::ll_index(in_stack_ffffffffffffff80,(vm_val_t *)in_stack_ffffffffffffff78.p_,
                         in_stack_ffffffffffffff74);
      iVar2 = vm_val_t::is_listlike
                        ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      if (iVar2 == 0) {
        err_throw(0);
      }
      vm_val_t::ll_index(in_stack_ffffffffffffff80,(vm_val_t *)in_stack_ffffffffffffff78.p_,
                         in_stack_ffffffffffffff74);
      in_stack_ffffffffffffff80 = (vm_val_t *)vm_val_t::get_as_string(in_stack_ffffffffffffff58);
      if (in_stack_ffffffffffffff80 == (vm_val_t *)0x0) {
        err_throw(0);
      }
      utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffff78,
                    (char *)((long)&in_stack_ffffffffffffff80->typ + 2));
      vmb_get_len((char *)0x338312);
      sVar4 = utf8_ptr::len((utf8_ptr *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (size_t)in_stack_ffffffffffffff58);
      reader_00 = (CVmObjStrCompMapReader *)((long)&reader_00->_vptr_CVmObjStrCompMapReader + sVar4)
      ;
    }
  }
  obj_id = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  case_sensitive_00 = vm_new_id(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,obj_id);
  lst_00 = (vm_val_t *)
           CVmObject::operator_new
                     (CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),obj_id);
  CVmObjStrComp((CVmObjStrComp *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  CVmObjStrCompMapReaderList::CVmObjStrCompMapReaderList
            ((CVmObjStrCompMapReaderList *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),lst_00);
  alloc_ext((CVmObjStrComp *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(size_t)pvVar3,
            case_sensitive_00,(size_t)lst_00,total_chars_00,reader_00);
  CVmStack::discard();
  return case_sensitive_00;
}

Assistant:

vm_obj_id_t CVmObjStrComp::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    size_t trunc_len;
    int case_sensitive;
    const vm_val_t *lst;
    vm_obj_id_t id;
    CVmObjStrComp *obj;
    size_t equiv_cnt;
    size_t total_chars;
    
    /* check arguments */
    if (argc != 3)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* pop the truncation length parameter */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* it's nil, so truncation is not allowed */
        trunc_len = 0;
        G_stk->discard();
    }
    else
    {
        /* retrieve the truncation length as an integer */
        trunc_len = CVmBif::pop_int_val(vmg0_);
    }

    /* get the case sensitivity flag */
    case_sensitive = CVmBif::pop_bool_val(vmg0_);

    /* 
     *   retrieve the mapping list, but leave it on the stack (for gc
     *   protection) 
     */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* there are no mappings */
        lst = 0;
        equiv_cnt = 0;
        total_chars = 0;
    }
    else
    {
        size_t i;
        int ec;
        
        /* get the list value from the argument */
        lst = G_stk->get(0);
        if (!lst->is_listlike(vmg0_)
            || (ec = lst->ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* run through the list and count the value string characters */
        for (i = 1, total_chars = 0, equiv_cnt = ec ; i <= equiv_cnt ; ++i)
        {
            vm_val_t sublst;
            vm_val_t val;
            const char *strp;
            utf8_ptr ustrp;

            /* get this mapping from the list */
            lst->ll_index(vmg_ &sublst, i);

            /* make sure it's a sublist */
            if (!sublst.is_listlike(vmg0_))
                err_throw(VMERR_BAD_TYPE_BIF);

            /* 
             *   get the second element of the mapping sublist - this is the
             *   value string 
             */
            sublst.ll_index(vmg_ &val, 2);
            if ((strp = val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* add the character length of the string to the total */
            ustrp.set((char *)strp + VMB_LEN);
            total_chars += ustrp.len(vmb_get_len(strp));
        }
    }

    /* create the new object */
    id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    obj = new (vmg_ id) CVmObjStrComp();

    /* set up a list-based mapping reader */
    CVmObjStrCompMapReaderList reader(lst);

    /* allocate and initialize the new object's extension */
    obj->alloc_ext(vmg_ trunc_len, case_sensitive, equiv_cnt, total_chars,
                   &reader);

    /* discard the gc protection */
    G_stk->discard();

    /* return the new object */
    return id;
}